

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::SetRegAllowStackVar<unsigned_int>
          (InterpreterStackFrame *this,uint localRegisterID,Var value)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  
  if (localRegisterID != 0) {
    RVar3 = FunctionBody::GetConstantCount(*(FunctionBody **)(this + 0x88));
    if (localRegisterID < RVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x1f9c,
                                  "(localRegisterID == 0 || localRegisterID >= m_functionBody->GetConstantCount())"
                                  ,
                                  "localRegisterID == 0 || localRegisterID >= m_functionBody->GetConstantCount()"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  ValidateRegValue(this,value,true,true);
  *(Var *)(this + (ulong)localRegisterID * 8 + 0x160) = value;
  return;
}

Assistant:

void InterpreterStackFrame::SetRegAllowStackVar(RegSlotType localRegisterID, Var value)
    {
        Assert(localRegisterID == 0 || localRegisterID >= m_functionBody->GetConstantCount());
        ValidateRegValue(value, true);
        m_localSlots[localRegisterID] = value;

#if ENABLE_OBJECT_SOURCE_TRACKING
        if (value != nullptr && DynamicType::Is(Js::JavascriptOperators::GetTypeId(value)))
        {
            static_cast<DynamicObject*>(value)->SetDiagOriginInfoAsNeeded();
        }
#endif

#if ENABLE_VALUE_TRACE
        if (this->function->GetScriptContext()->ShouldPerformRecordOrReplayAction())
        {
            this->function->GetScriptContext()->GetThreadContext()->TTDExecutionInfo->GetTraceLogger()->WriteTraceValue(value);
        }
#endif
    }